

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall dynamicgraph::Entity::~Entity(Entity *this)

{
  Entity *this_local;
  
  ~Entity(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

Entity::~Entity() {
  dgDEBUG(25) << "# In (" << name << " { " << endl;
  for (std::map<const std::string, Command *>::iterator it = commandMap.begin();
       it != commandMap.end(); ++it) {
    delete it->second;
  }
  dgDEBUGOUT(25);
}